

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_mul(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak32)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  int overflow;
  int ret;
  secp256k1_scalar factor;
  secp256k1_ge p;
  uint7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar2;
  int iVar3;
  uint uVar4;
  secp256k1_context *in_stack_ffffffffffffff68;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  secp256k1_ge *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  uVar4 = 0;
  iVar3 = 0;
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)0x0,
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    local_4 = 0;
  }
  else {
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffff70,(uchar *)in_stack_ffffffffffffff68,(int *)0x0);
    uVar2 = false;
    if (iVar3 == 0) {
      iVar1 = secp256k1_pubkey_load
                        (in_stack_ffffffffffffff68,(secp256k1_ge *)((ulong)uVar4 << 0x20),
                         (secp256k1_pubkey *)(ulong)in_stack_ffffffffffffff58);
      uVar2 = iVar1 != 0;
    }
    local_4 = (uint)(byte)uVar2;
    memset(in_RSI,0,0x40);
    if (local_4 != 0) {
      iVar1 = secp256k1_eckey_pubkey_tweak_mul(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_pubkey_save
                  ((secp256k1_pubkey *)CONCAT44(local_4,iVar3),
                   (secp256k1_ge *)CONCAT17(uVar2,in_stack_ffffffffffffff58));
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_ec_pubkey_tweak_mul(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak32) {
    secp256k1_ge p;
    secp256k1_scalar factor;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_mul(&p, &factor)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}